

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCoroutine.cpp
# Opt level: O2

void __thiscall
Jinx::Impl::Coroutine::Coroutine
          (Coroutine *this,shared_ptr<Jinx::Impl::Script> *script,RuntimeID functionID,
          Parameters *params)

{
  ScriptIPtr *this_00;
  pointer pVVar1;
  Script *this_01;
  bool bVar2;
  char *message;
  Variant *param;
  pointer value;
  FunctionDefinitionPtr functionDef;
  any local_98;
  Any local_88;
  shared_ptr<Jinx::Impl::Runtime> runtime;
  undefined1 local_68 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_50 [4];
  
  (this->super_ICoroutine)._vptr_ICoroutine = (_func_int **)&PTR_IsFinished_0014fc50;
  (this->m_returnValue).m_type = Null;
  (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->m_script).super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::static_pointer_cast<Jinx::Impl::Runtime,Jinx::Impl::Runtime>(&runtime);
  Runtime::FindFunction
            ((Runtime *)&functionDef,
             (RuntimeID)
             runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (functionDef.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    message = "Could not find function definition for coroutine";
  }
  else {
    if (((functionDef.super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        != (element_type *)0x0) {
      std::__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2> *)&local_88,
                 &((functionDef.
                    super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr)->m_bytecode).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>
                );
      std::any::any(&local_98,
                    &((script->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_userContext);
      Runtime::CreateScript
                ((Runtime *)local_68,
                 (BufferPtr *)
                 runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 &local_88);
      this_00 = &this->m_script;
      std::static_pointer_cast<Jinx::Impl::Script,Jinx::IScript>
                ((shared_ptr<Jinx::IScript> *)(local_68 + 0x10));
      std::__shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&this_00->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2> *)(local_68 + 0x10));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
      std::any::reset(&local_98);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_88._M_storage);
      pVVar1 = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      for (value = (params->super__Vector_base<Jinx::Variant,_Jinx::Allocator<Jinx::Variant>_>).
                   _M_impl.super__Vector_impl_data._M_start;
          this_01 = (this_00->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr, value != pVVar1; value = value + 1) {
        Script::Push(this_01,value);
      }
      Script::CallBytecodeFunction(this_01,&functionDef,Finish);
      Script::Execute((this_00->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr);
      bVar2 = Script::IsFinished((this_00->
                                 super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)
                                 ._M_ptr);
      if (bVar2) {
        Script::Pop((Variant *)(local_68 + 0x10),
                    (this_00->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr);
        Variant::operator=(&this->m_returnValue,(Variant *)(local_68 + 0x10));
        Variant::~Variant((Variant *)(local_68 + 0x10));
      }
      goto LAB_0011d203;
    }
    message = "Native function can\'t be called as asynchronously as a coroutine";
  }
  Script::Error((script->super___shared_ptr<Jinx::Impl::Script,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                message);
LAB_0011d203:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&functionDef.
              super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&runtime.super___shared_ptr<Jinx::Impl::Runtime,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

inline_t Coroutine::Coroutine(const std::shared_ptr<Script> & script, RuntimeID functionID, const Parameters & params)
	{
		auto runtime = script->GetRuntime();
		FunctionDefinitionPtr functionDef = runtime->FindFunction(functionID);
		if (!functionDef)
		{
			script->Error("Could not find function definition for coroutine");
			return;
		}
		if (!functionDef->GetBytecode())
		{
			script->Error("Native function can't be called as asynchronously as a coroutine");
			return;
		}

		// Create a script to act as a coroutine.
		m_script = std::static_pointer_cast<Script>(runtime->CreateScript(functionDef->GetBytecode(), script->GetUserContext()));

		// Push all parameters in script stack
		for (const auto & param : params)
			m_script->Push(param);

		// Call the bytecode function, indicating the script should finish execution on return
		m_script->CallBytecodeFunction(functionDef, Script::OnReturn::Finish);

		// Initial script execution
		m_script->Execute();
		if (m_script->IsFinished())
			m_returnValue = m_script->Pop();
	}